

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O2

void __thiscall antlr::TreeParser::reportWarning(TreeParser *this,string *s)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"warning: ");
  poVar1 = std::operator<<(poVar1,(s->_M_dataplus)._M_p);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void TreeParser::reportWarning(const ANTLR_USE_NAMESPACE(std)string& s)
{
	ANTLR_USE_NAMESPACE(std)cerr << "warning: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}